

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O0

void Test_TemplateModifiers_AddModifier::Run(void)

{
  byte bVar1;
  ulong uVar2;
  NullModifier local_18 [8];
  NullModifier foo_modifier;
  ModifierInfo *info;
  
  uVar2 = ctemplate::AddModifier("x-atest",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar2 & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "ctemplate::AddModifier(\"x-atest\", &ctemplate::html_escape)");
    exit(1);
  }
  uVar2 = ctemplate::AddModifier("x-atest-arg=",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar2 & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "ctemplate::AddModifier(\"x-atest-arg=\", &ctemplate::html_escape)");
    exit(1);
  }
  uVar2 = ctemplate::AddModifier("x-atest-arg=h",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar2 & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "ctemplate::AddModifier(\"x-atest-arg=h\", &ctemplate::html_escape)");
    exit(1);
  }
  uVar2 = ctemplate::AddModifier("x-atest-arg=html",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar2 & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "ctemplate::AddModifier(\"x-atest-arg=html\", &ctemplate::html_escape)");
    exit(1);
  }
  uVar2 = ctemplate::AddModifier("x-atest-arg=json",(TemplateModifier *)&ctemplate::json_escape);
  if ((uVar2 & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "ctemplate::AddModifier(\"x-atest-arg=json\", &ctemplate::json_escape)");
    exit(1);
  }
  uVar2 = ctemplate::AddModifier("x-atest-arg=j",(TemplateModifier *)&ctemplate::json_escape);
  if ((uVar2 & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "ctemplate::AddModifier(\"x-atest-arg=j\", &ctemplate::json_escape)");
    exit(1);
  }
  uVar2 = ctemplate::AddModifier("x-atest-arg=J",(TemplateModifier *)&ctemplate::json_escape);
  if ((uVar2 & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "ctemplate::AddModifier(\"x-atest-arg=J\", &ctemplate::json_escape)");
    exit(1);
  }
  uVar2 = ctemplate::AddModifier("test",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar2 & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "!(ctemplate::AddModifier(\"test\", &ctemplate::html_escape))");
    exit(1);
  }
  uVar2 = ctemplate::AddModifier("x-atest",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar2 & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "!(ctemplate::AddModifier(\"x-atest\", &ctemplate::html_escape))");
    exit(1);
  }
  uVar2 = ctemplate::AddModifier("x-atest-arg=",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar2 & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "!(ctemplate::AddModifier(\"x-atest-arg=\", &ctemplate::html_escape))");
    exit(1);
  }
  uVar2 = ctemplate::AddModifier("x-atest-arg=h",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar2 & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "!(ctemplate::AddModifier(\"x-atest-arg=h\", &ctemplate::html_escape))");
    exit(1);
  }
  uVar2 = ctemplate::AddModifier("x-atest-arg=html",(TemplateModifier *)&ctemplate::html_escape);
  if ((uVar2 & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "!(ctemplate::AddModifier(\"x-atest-arg=html\", &ctemplate::html_escape))");
    exit(1);
  }
  _foo_modifier = ctemplate::FindModifier("x-atest",7,"",0);
  if (_foo_modifier == 0) {
    fprintf(_stderr,"Check failed: %s\n","(info = ctemplate::FindModifier(\"x-atest\", 7, \"\", 0))"
           );
    exit(1);
  }
  if ((*(byte *)(_foo_modifier + 0x21) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","!(info->modval_required)");
    exit(1);
  }
  _foo_modifier = ctemplate::FindModifier("x-foo",5,"",0);
  if (_foo_modifier == 0) {
    fprintf(_stderr,"Check failed: %s\n","(info = ctemplate::FindModifier(\"x-foo\", 5, \"\", 0))");
    exit(1);
  }
  if ((*(byte *)(_foo_modifier + 0x22) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","!(info->is_registered)");
    exit(1);
  }
  ctemplate::NullModifier::NullModifier(local_18);
  bVar1 = ctemplate::AddModifier("x-foo",(TemplateModifier *)local_18);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n","ctemplate::AddModifier(\"x-foo\", &foo_modifier)");
    exit(1);
  }
  _foo_modifier = ctemplate::FindModifier("x-foo",5,"",0);
  if (_foo_modifier == 0) {
    fprintf(_stderr,"Check failed: %s\n","(info = ctemplate::FindModifier(\"x-foo\", 5, \"\", 0))");
    exit(1);
  }
  if (*(NullModifier **)(_foo_modifier + 0x28) != local_18) {
    fprintf(_stderr,"Check failed: %s %s %s\n","info->modifier","==","&foo_modifier");
    exit(1);
  }
  ctemplate::NullModifier::~NullModifier(local_18);
  return;
}

Assistant:

TEST(TemplateModifiers, AddModifier) {
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=h", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=html", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=json", &GOOGLE_NAMESPACE::json_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=j", &GOOGLE_NAMESPACE::json_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=J", &GOOGLE_NAMESPACE::json_escape));

  // Make sure AddModifier fails with an invalid name.
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("test", &GOOGLE_NAMESPACE::html_escape));

  // Make sure AddModifier fails with a duplicate name.
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-atest", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=h", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=html", &GOOGLE_NAMESPACE::html_escape));

  const GOOGLE_NAMESPACE::ModifierInfo* info;
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-atest", 7, "", 0)));
  EXPECT_FALSE(info->modval_required);

  // Make sure we can still add a modifier after having already
  // searched for it.
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-foo", 5, "", 0)));
  EXPECT_FALSE(info->is_registered);

  GOOGLE_NAMESPACE::NullModifier foo_modifier;
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-foo", &foo_modifier));
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-foo", 5, "", 0)));
  EXPECT_EQ(info->modifier, &foo_modifier);
}